

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_anPrDuDgn(HModel *this)

{
  value_type vVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  reference pvVar6;
  double *pdVar7;
  uint *puVar8;
  reference pvVar9;
  undefined8 uVar10;
  long in_RDI;
  double *__a;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  double dVar11;
  double extraout_XMM0_Qa_00;
  double dVar12;
  double pctDgnDuAct;
  double duAct;
  int var;
  double pctDgnPrAct;
  double rsdu;
  double prAct;
  int row;
  double TlDuIfs;
  double TlPrIfs;
  int numDgnDuAct;
  double normDuAct;
  int numDgnPrAct;
  double normPrAct;
  uint local_6c;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  uint local_3c;
  double local_38;
  double local_30;
  uint local_24;
  double local_20;
  uint local_14;
  double local_10;
  
  local_10 = 0.0;
  local_14 = 0;
  local_20 = 0.0;
  local_24 = 0;
  local_30 = *(double *)(in_RDI + 0x28);
  local_38 = *(double *)(in_RDI + 0x30);
  for (local_3c = 0; (int)local_3c < *(int *)(in_RDI + 0x610); local_3c = local_3c + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x870),
                        (long)(int)local_3c);
    local_48 = *pvVar6;
    local_10 = local_48 * local_48 + local_10;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x840),
                        (long)(int)local_3c);
    dVar11 = local_48;
    local_58 = *pvVar6 - local_48;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x858),
                        (long)(int)local_3c);
    local_60 = dVar11 - *pvVar6;
    __a = &local_58;
    pdVar7 = std::max<double>(__a,&local_60);
    local_50 = *pdVar7;
    std::abs((int)__a);
    uVar5 = local_3c;
    if (extraout_XMM0_Qa < local_30) {
      local_14 = local_14 + 1;
    }
    puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),
                                (long)(int)local_3c);
    uVar2 = *puVar8;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x840),
                        (long)(int)local_3c);
    dVar11 = local_48;
    vVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x858),
                        (long)(int)local_3c);
    printf("Basic variable %7d is %7d: [%11.4g, %11.4g, %11.4g] Rsdu = %11.4g; numDgnPrAct = %7d\n",
           vVar1,dVar11,*pvVar6,local_50,(ulong)uVar5,(ulong)uVar2,(ulong)local_14);
  }
  local_10 = sqrt(local_10);
  dVar11 = (double)(int)local_14;
  iVar3 = *(int *)(in_RDI + 0x610);
  for (local_6c = 0; (int)local_6c < *(int *)(in_RDI + 0x614); local_6c = local_6c + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)local_6c);
    if (*pvVar9 == 1) {
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)(int)local_6c)
      ;
      dVar12 = *pvVar6;
      local_20 = dVar12 * dVar12 + local_20;
      std::abs((int)this_00);
      if (extraout_XMM0_Qa_00 < local_38) {
        local_24 = local_24 + 1;
      }
      printf("Variable %7d is nonbasic: %11.4g; numDgnDuAct = %7d\n",dVar12,(ulong)local_6c,
             (ulong)local_24);
    }
  }
  local_20 = sqrt(local_20);
  dVar12 = (double)(int)local_24;
  iVar4 = *(int *)(in_RDI + 0x60c);
  uVar10 = std::__cxx11::string::c_str();
  printf("anPrDuDgn: model %s: ||BcPrAct|| = %g; numDgnPrAct = %d of %d (%7.2f%%); ||NonBcDuAct|| = %g; numDgnDuAct = %d of %d (%7.2f%%)\n"
         ,local_10,(dVar11 * 100.0) / (double)iVar3,local_20,(dVar12 * 100.0) / (double)iVar4,uVar10
         ,(ulong)local_14,(ulong)*(uint *)(in_RDI + 0x610),(ulong)local_24,
         (ulong)*(uint *)(in_RDI + 0x60c));
  uVar10 = std::__cxx11::string::c_str();
  printf("GrepAnPrDuDgn,%s,%g,%d,%d,%g,%d,%d\n",local_10,local_20,uVar10,(ulong)local_14,
         (ulong)*(uint *)(in_RDI + 0x610),(ulong)local_24,(ulong)*(uint *)(in_RDI + 0x60c));
  return;
}

Assistant:

void HModel::util_anPrDuDgn() {
  double normPrAct = 0;
  int numDgnPrAct = 0;
  double normDuAct = 0;
  int numDgnDuAct = 0;
  double TlPrIfs = dblOption[DBLOPT_PRIMAL_TOL];
  double TlDuIfs = dblOption[DBLOPT_DUAL_TOL];
  for (int row=0; row < numRow; row++) {
    double prAct = baseValue[row];
    normPrAct += prAct*prAct;
    double rsdu = max(baseLower[row]-prAct, prAct-baseUpper[row]);
    if (abs(rsdu) < TlPrIfs) {numDgnPrAct++;}
    printf("Basic variable %7d is %7d: [%11.4g, %11.4g, %11.4g] Rsdu = %11.4g; numDgnPrAct = %7d\n",
	   row, basicIndex[row], baseLower[row], prAct, baseUpper[row], rsdu, numDgnPrAct);
  }
  normPrAct = sqrt(normPrAct);
  double pctDgnPrAct = numDgnPrAct;
  pctDgnPrAct = 100*pctDgnPrAct/numRow;

  for (int var=0; var < numTot; var++) {
    if (nonbasicFlag[var] == NONBASIC_FLAG_TRUE) {
      double duAct = workDual[var];
      normDuAct += duAct*duAct;
      if (abs(duAct) < TlDuIfs) {numDgnDuAct++;}
      printf("Variable %7d is nonbasic: %11.4g; numDgnDuAct = %7d\n", var, duAct, numDgnDuAct);
    }
  }
  normDuAct = sqrt(normDuAct);
  double pctDgnDuAct = numDgnDuAct;
  pctDgnDuAct = 100*pctDgnDuAct/numCol;

  printf("anPrDuDgn: model %s: ||BcPrAct|| = %g; numDgnPrAct = %d of %d (%7.2f%%); ||NonBcDuAct|| = %g; numDgnDuAct = %d of %d (%7.2f%%)\n",
	 modelName.c_str(), normPrAct, numDgnPrAct, numRow, pctDgnPrAct, normDuAct, numDgnDuAct, numCol, pctDgnDuAct);
  printf("GrepAnPrDuDgn,%s,%g,%d,%d,%g,%d,%d\n",
	 modelName.c_str(), normPrAct, numDgnPrAct, numRow, normDuAct, numDgnDuAct, numCol);
  
}